

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_bitset_container_xor
                (array_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  bool bVar1;
  bitset_container_t *dest;
  uint64_t uVar2;
  array_container_t *paVar3;
  bitset_container_t *result;
  container_t **dst_local;
  bitset_container_t *src_2_local;
  array_container_t *src_1_local;
  
  dest = bitset_container_create();
  bitset_container_copy(src_2,dest);
  uVar2 = bitset_flip_list_withcard
                    (dest->words,(long)dest->cardinality,src_1->array,(long)src_1->cardinality);
  dest->cardinality = (int32_t)uVar2;
  bVar1 = 0x1000 < dest->cardinality;
  if (bVar1) {
    *dst = dest;
  }
  else {
    paVar3 = array_container_from_bitset(dest);
    *dst = paVar3;
    bitset_container_free(dest);
  }
  return bVar1;
}

Assistant:

bool array_bitset_container_xor(
    const array_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    bitset_container_t *result = bitset_container_create();
    bitset_container_copy(src_2, result);
    result->cardinality = (int32_t)bitset_flip_list_withcard(
        result->words, result->cardinality, src_1->array, src_1->cardinality);

    // do required type conversions.
    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}